

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O2

Vec_Int_t * Gia_GlaConvertToFla(Gia_Man_t *p,Vec_Int_t *vGla)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int i;
  
  p_00 = Vec_IntStart(p->nRegs);
  i = 0;
  while( true ) {
    if (p->nRegs <= i) {
      return p_00;
    }
    pObj = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + i);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p,pObj);
    iVar1 = Vec_IntEntry(vGla,iVar1);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(p_00,i,1);
    }
    i = i + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_GlaConvertToFla( Gia_Man_t * p, Vec_Int_t * vGla )
{
    Vec_Int_t * vFla;
    Gia_Obj_t * pObj;
    int i;
    vFla = Vec_IntStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(vGla, Gia_ObjId(p, pObj)) )
            Vec_IntWriteEntry( vFla, i, 1 );
    return vFla;
}